

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O1

void __thiscall TCPSocket::receiven(TCPSocket *this,char *buffer,int size)

{
  uint uVar1;
  
  do {
    uVar1 = receive(this,buffer,size);
    buffer = buffer + uVar1;
    size = size - uVar1;
  } while (size != 0);
  return;
}

Assistant:

void TCPSocket::receiven(char *buffer, int size) {
    int left = size;
    do{
        int recvd = receive(buffer, left);
        left -= recvd;
        buffer += recvd;
    }while(left != 0);
}